

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sturm.cpp
# Opt level: O2

double __thiscall opengv::math::Sturm::computeLagrangianBound(Sturm *this)

{
  double *pdVar1;
  long lVar2;
  size_t i_1;
  size_t i;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 in_XMM3 [16];
  vector<double,_std::allocator<double>_> coefficients;
  double local_28;
  
  coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::reserve(&coefficients,this->_dimension - 1);
  for (lVar4 = 1; lVar4 - 1U < this->_dimension - 1; lVar4 = lVar4 + 1) {
    pdVar1 = (this->_C).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data;
    auVar7._0_8_ = pdVar1[(this->_C).
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                          .m_rows * lVar4] / *pdVar1;
    auVar7._8_8_ = 0;
    auVar8._8_8_ = 0x7fffffffffffffff;
    auVar8._0_8_ = 0x7fffffffffffffff;
    auVar5 = vandpd_avx512vl(auVar7,auVar8);
    auVar8 = vcvtusi2sd_avx512f(in_XMM3,lVar4);
    local_28 = pow(auVar5._0_8_,1.0 / auVar8._0_8_);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(&coefficients,&local_28);
  }
  auVar8 = ZEXT816(0xbff0000000000000);
  lVar4 = 0;
  lVar2 = (long)coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  for (lVar3 = 0; dVar6 = auVar8._0_8_, lVar2 != lVar3; lVar3 = lVar3 + 1) {
    auVar9._8_8_ = 0;
    auVar9._0_8_ = coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar3];
    auVar8 = vmaxsd_avx(auVar9,auVar8);
    if (dVar6 < coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar3]) {
      lVar4 = lVar3;
    }
  }
  auVar8 = ZEXT816(0xbff0000000000000);
  coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[lVar4] = -1.0;
  lVar4 = 0;
  while (lVar2 != lVar4) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar4];
    lVar4 = lVar4 + 1;
    auVar8 = vmaxsd_avx(auVar5,auVar8);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&coefficients.super__Vector_base<double,_std::allocator<double>_>);
  return dVar6 + auVar8._0_8_;
}

Assistant:

double
opengv::math::Sturm::computeLagrangianBound()
{
  std::vector<double> coefficients;
  coefficients.reserve(_dimension-1);

  for(size_t i=0; i < _dimension-1; i++)
    coefficients.push_back(pow(fabs(_C(0,i+1)/_C(0,0)),(1.0/(i+1))));

  size_t j = 0;
  double max1 = -1.0;
  for( size_t i = 0; i < coefficients.size(); i++ )
  {
    if( coefficients[i] > max1 )
    {
      j = i;
      max1 = coefficients[i];
    }
  }

  coefficients[j] = -1.0;

  double max2 = -1.0;
  for( size_t i=0; i < coefficients.size(); i++ )
  {
    if( coefficients[i] > max2 )
      max2 = coefficients[i];
  }

  double bound = max1 + max2;
  return bound;
}